

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O1

Ptr __thiscall
TgBot::TgTypeParser::parseJsonAndGetInlineQueryResultVenue(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  self_type *psVar2;
  long *plVar3;
  optional<int> oVar4;
  int iVar5;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  dummy_u *pdVar7;
  long *plVar8;
  type_conflict3 tVar9;
  Ptr PVar10;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  path_type local_a8;
  dummy_u local_78;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  TgTypeParser *local_38;
  
  *(undefined8 *)this = 0;
  local_38 = this + 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TgBot::InlineQueryResultVenue,std::allocator<TgBot::InlineQueryResultVenue>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_38,(InlineQueryResultVenue **)this,
             (allocator<TgBot::InlineQueryResultVenue> *)&local_a8);
  paVar1 = &local_a8.m_value.field_2;
  local_a8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"latitude","");
  local_a8.m_separator = '.';
  local_a8.m_start._M_current = local_a8.m_value._M_dataplus._M_p;
  psVar2 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_a8);
  std::locale::locale((locale *)local_58);
  std::locale::locale((locale *)&local_d0,(locale *)local_58);
  tVar9 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<float,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,float>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)psVar2,
                     (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_float> *
                     )&local_d0);
  std::locale::~locale((locale *)&local_d0);
  std::locale::~locale((locale *)local_58);
  *(type_conflict3 *)(*(long *)this + 0xa8) = tVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_value._M_dataplus._M_p);
  }
  local_a8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"longitude","");
  local_a8.m_separator = '.';
  local_a8.m_start._M_current = local_a8.m_value._M_dataplus._M_p;
  psVar2 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_a8);
  std::locale::locale((locale *)local_58);
  std::locale::locale((locale *)&local_d0,(locale *)local_58);
  tVar9 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<float,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,float>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)psVar2,
                     (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_float> *
                     )&local_d0);
  std::locale::~locale((locale *)&local_d0);
  std::locale::~locale((locale *)local_58);
  *(type_conflict3 *)(*(long *)this + 0xac) = tVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_value._M_dataplus._M_p);
  }
  local_a8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"address","");
  local_a8.m_separator = '.';
  local_a8.m_start._M_current = local_a8.m_value._M_dataplus._M_p;
  psVar2 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_a8);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (&local_d0,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)psVar2);
  std::__cxx11::string::operator=((string *)(*(long *)this + 0xb0),(string *)&local_d0);
  if ((void *)CONCAT71(local_d0.super_type._1_7_,local_d0.super_type.m_initialized) !=
      (void *)((long)&local_d0.super_type.m_storage.dummy_ + 8U)) {
    operator_delete((void *)CONCAT71(local_d0.super_type._1_7_,local_d0.super_type.m_initialized));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_value._M_dataplus._M_p);
  }
  local_a8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"foursquare_id","");
  local_a8.m_separator = '.';
  local_a8.m_start._M_current = local_a8.m_value._M_dataplus._M_p;
  local_78.aligner_ = (type)((long)local_78.data + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            (&local_d0,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_a8);
  pdVar7 = &local_78;
  if ((locale)local_d0.super_type.m_initialized != (locale)0x0) {
    pdVar7 = &local_d0.super_type.m_storage.dummy_;
  }
  plVar8 = (long *)(local_78.data + 8);
  plVar3 = plVar8;
  if ((locale)local_d0.super_type.m_initialized != (locale)0x0) {
    plVar3 = (long *)((long)&local_d0.super_type.m_storage.dummy_ + 8);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pdVar7->aligner_,*plVar3 + (long)pdVar7->aligner_);
  if ((locale)local_d0.super_type.m_initialized == (locale)0x1) {
    if (local_d0.super_type.m_storage.dummy_.aligner_ !=
        (type)((long)&local_d0.super_type.m_storage.dummy_ + 0x10U)) {
      operator_delete((void *)local_d0.super_type.m_storage.dummy_.aligner_);
    }
    local_d0.super_type.m_initialized = false;
  }
  std::__cxx11::string::operator=((string *)(*(long *)this + 0xd0),(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  if (local_78.aligner_ != (type)((long)local_78.data + 0x10)) {
    operator_delete((void *)local_78.aligner_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_value._M_dataplus._M_p);
  }
  local_a8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"foursquare_type","");
  local_a8.m_separator = '.';
  local_a8.m_start._M_current = local_a8.m_value._M_dataplus._M_p;
  local_78.aligner_ = (type)((long)local_78.data + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            (&local_d0,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_a8);
  pdVar7 = &local_78;
  if ((locale)local_d0.super_type.m_initialized != (locale)0x0) {
    pdVar7 = &local_d0.super_type.m_storage.dummy_;
  }
  plVar3 = plVar8;
  if ((locale)local_d0.super_type.m_initialized != (locale)0x0) {
    plVar3 = (long *)((long)&local_d0.super_type.m_storage.dummy_ + 8);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pdVar7->aligner_,*plVar3 + (long)pdVar7->aligner_);
  if ((locale)local_d0.super_type.m_initialized == (locale)0x1) {
    if (local_d0.super_type.m_storage.dummy_.aligner_ !=
        (type)((long)&local_d0.super_type.m_storage.dummy_ + 0x10U)) {
      operator_delete((void *)local_d0.super_type.m_storage.dummy_.aligner_);
    }
    local_d0.super_type.m_initialized = false;
  }
  std::__cxx11::string::operator=((string *)(*(long *)this + 0xf0),(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  if (local_78.aligner_ != (type)((long)local_78.data + 0x10)) {
    operator_delete((void *)local_78.aligner_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_value._M_dataplus._M_p);
  }
  local_a8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"thumb_url","");
  local_a8.m_separator = '.';
  local_a8.m_start._M_current = local_a8.m_value._M_dataplus._M_p;
  local_78.aligner_ = (type)((long)local_78.data + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            (&local_d0,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_a8);
  pdVar7 = &local_78;
  if ((locale)local_d0.super_type.m_initialized != (locale)0x0) {
    pdVar7 = &local_d0.super_type.m_storage.dummy_;
  }
  if ((locale)local_d0.super_type.m_initialized != (locale)0x0) {
    plVar8 = (long *)((long)&local_d0.super_type.m_storage.dummy_ + 8);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pdVar7->aligner_,*plVar8 + (long)pdVar7->aligner_);
  if ((locale)local_d0.super_type.m_initialized == (locale)0x1) {
    if (local_d0.super_type.m_storage.dummy_.aligner_ !=
        (type)((long)&local_d0.super_type.m_storage.dummy_ + 0x10U)) {
      operator_delete((void *)local_d0.super_type.m_storage.dummy_.aligner_);
    }
    local_d0.super_type.m_initialized = false;
  }
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x110),(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  if (local_78.aligner_ != (type)((long)local_78.data + 0x10)) {
    operator_delete((void *)local_78.aligner_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_value._M_dataplus._M_p);
  }
  local_a8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"thumb_width","");
  local_a8.m_separator = '.';
  local_a8.m_start._M_current = local_a8.m_value._M_dataplus._M_p;
  oVar4 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<int>(in_RDX,&local_a8);
  iVar5 = 0;
  if (((ulong)oVar4.super_type & 1) != 0) {
    iVar5 = oVar4.super_type.m_storage;
  }
  *(int *)(*(long *)this + 0x130) = iVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_value._M_dataplus._M_p);
  }
  local_a8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"thumb_height","");
  local_a8.m_separator = '.';
  local_a8.m_start._M_current = local_a8.m_value._M_dataplus._M_p;
  oVar4 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<int>(in_RDX,&local_a8);
  _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (((ulong)oVar4.super_type & 1) != 0) {
    _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)oVar4.super_type >> 0x20);
  }
  *(int *)(*(long *)this + 0x134) = (int)_Var6._M_pi;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_value._M_dataplus._M_p);
    _Var6._M_pi = extraout_RDX;
  }
  PVar10.super___shared_ptr<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var6._M_pi;
  PVar10.super___shared_ptr<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar10.super___shared_ptr<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

InlineQueryResultVenue::Ptr TgTypeParser::parseJsonAndGetInlineQueryResultVenue(const boost::property_tree::ptree& data) const {
    // NOTE: This function will be called by parseJsonAndGgetInlineQueryResult().
    auto result(make_shared<InlineQueryResultVenue>());
    result->latitude = data.get<float>("latitude");
    result->longitude = data.get<float>("longitude");
    result->address = data.get<string>("address");
    result->foursquareId = data.get<string>("foursquare_id", "");
    result->foursquareType = data.get<string>("foursquare_type", "");
    result->thumbUrl = data.get<string>("thumb_url", "");
    result->thumbWidth = data.get<int32_t>("thumb_width", 0);
    result->thumbHeight = data.get<int32_t>("thumb_height", 0);
    return result;
}